

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
format_uint<4u,char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_int>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,uint value,int num_digits,
          bool upper)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar1;
  char buffer [9];
  char local_31 [9];
  
  to_unsigned<int>(num_digits);
  format_uint<4u,char,unsigned_int>(local_31,value,num_digits,upper);
  bVar1 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                    (local_31,local_31 + num_digits,out);
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar1.container;
}

Assistant:

inline It format_uint(It out, UInt value, int num_digits, bool upper = false) {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str<Char>(buffer, buffer + num_digits, out);
}